

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

bool check_event(Am_Object *inter,Am_Object *event_window,Am_Input_Char input_char,
                Am_Slot_Key when_slot,Am_Input_Char *deferred)

{
  bool bVar1;
  Am_Value *pAVar2;
  undefined1 local_70 [8];
  Am_Value list_value;
  Am_Value_List choices;
  undefined1 local_40 [8];
  Am_Value slot_value;
  Am_Input_Char *deferred_local;
  Am_Slot_Key when_slot_local;
  Am_Object *event_window_local;
  Am_Object *inter_local;
  Am_Input_Char input_char_local;
  
  slot_value.value = (anon_union_8_8_ea4c8939_for_value)deferred;
  Am_Value::Am_Value((Am_Value *)local_40);
  pAVar2 = Am_Object::Peek(inter,when_slot,0);
  Am_Value::operator=((Am_Value *)local_40,pAVar2);
  Am_Input_Char::operator=((Am_Input_Char *)slot_value.value.wrapper_value,&Am_No_Input_Char);
  bVar1 = Am_Value_List::Test((Am_Value *)local_40);
  if (bVar1) {
    Am_Value_List::Am_Value_List((Am_Value_List *)&list_value.value,(Am_Value *)local_40);
    Am_Value::Am_Value((Am_Value *)local_70);
    Am_Value_List::Start((Am_Value_List *)&list_value.value);
    while( true ) {
      bVar1 = Am_Value_List::Last((Am_Value_List *)&list_value.value);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pAVar2 = Am_Value_List::Get((Am_Value_List *)&list_value.value);
      Am_Value::operator=((Am_Value *)local_70,pAVar2);
      bVar1 = int_check_event(inter,event_window,input_char,0,(Am_Value *)local_70,slot_value.value)
      ;
      if (bVar1) {
        inter_local._7_1_ = true;
        goto LAB_0022e811;
      }
      Am_Value_List::Next((Am_Value_List *)&list_value.value);
    }
    inter_local._7_1_ = false;
LAB_0022e811:
    Am_Value::~Am_Value((Am_Value *)local_70);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&list_value.value);
  }
  else {
    inter_local._7_1_ =
         int_check_event(inter,event_window,input_char,when_slot,(Am_Value *)local_40,
                         slot_value.value);
  }
  Am_Value::~Am_Value((Am_Value *)local_40);
  return inter_local._7_1_;
}

Assistant:

static bool
check_event(Am_Object &inter, Am_Object &event_window, Am_Input_Char input_char,
            Am_Slot_Key when_slot, Am_Input_Char &deferred)
{
  Am_Value slot_value;
  slot_value = inter.Peek(when_slot);
  deferred = Am_No_Input_Char; //normal case

#ifdef DEBUG
  if (Am_Inter_Tracing(inter)) {
    std::cout << "Checking ";
    switch (when_slot) {
    case Am_START_WHEN:
      std::cout << "start";
      break;
    case Am_ABORT_WHEN:
      std::cout << "abort";
      break;
    case Am_STOP_WHEN:
      std::cout << "stop";
      break;
    }
    std::cout << " event = ";
  }
#endif
  if (Am_Value_List::Test(slot_value)) {
    Am_Value_List choices = slot_value;
    Am_Value list_value;
    Am_INTER_TRACE_PRINT(inter, " LIST");
    for (choices.Start(); !choices.Last(); choices.Next()) {
      list_value = choices.Get();
      Am_INTER_TRACE_PRINT_NOENDL(inter, "  Checking ");
      if (int_check_event(inter, event_window, input_char, 0, list_value,
                          deferred))
        return true;
    }
    return false; //nothing in the list matches
  } else
    return int_check_event(inter, event_window, input_char, when_slot,
                           slot_value, deferred);
}